

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.h
# Opt level: O0

Vector3f __thiscall Texture::get(Texture *this,Vector2f *x)

{
  TEXTURE_TYPE TVar1;
  code *pcVar2;
  float *pfVar3;
  Texture *in_RDX;
  Texture *in_RSI;
  Vector3f *in_RDI;
  undefined8 in_XMM0_Qa;
  double dVar4;
  float in_XMM1_Da;
  Vector3f VVar5;
  Vector3f VVar6;
  float q;
  float p;
  int r;
  int l;
  float b;
  float a;
  anon_class_8_1_8991fb9c pix;
  Vector3f *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  float fVar7;
  undefined4 in_stack_fffffffffffffed4;
  undefined8 in_stack_fffffffffffffee0;
  Texture *__args;
  float f;
  Vector3f *v0;
  Vector2f *in_stack_ffffffffffffffe0;
  Texture *this_00;
  undefined8 uVar8;
  float fVar9;
  
  f = (float)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  TVar1 = in_RSI->type;
  if (TVar1 == TEXTURE_COLOR) {
    Vector3f::Vector3f((Vector3f *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                       in_stack_fffffffffffffec8);
    VVar5.m_elements[2] = in_XMM1_Da;
    VVar5.m_elements[0] = (float)(int)in_XMM0_Qa;
    VVar5.m_elements[1] = (float)(int)((ulong)in_XMM0_Qa >> 0x20);
  }
  else if (TVar1 == TEXTURE_SCALE) {
    __args = in_RSI->source;
    this_00 = in_RDX;
    Vector2f::Vector2f((Vector2f *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                       (Vector2f *)in_stack_fffffffffffffec8);
    std::function<Vector2f_(Vector2f)>::operator()
              ((function<Vector2f_(Vector2f)> *)in_RDX,(Vector2f *)__args);
    VVar5 = get(this_00,in_stack_ffffffffffffffe0);
  }
  else {
    if (TVar1 != TEXTURE_RECT) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    v0 = in_RDI;
    pfVar3 = Vector2f::operator[]((Vector2f *)in_RDX,0);
    fVar7 = *pfVar3;
    pfVar3 = Vector2f::operator[]((Vector2f *)in_RDX,0);
    dVar4 = std::floor((double)(ulong)(uint)*pfVar3);
    clamp(in_RSI,fVar7 - SUB84(dVar4,0));
    pfVar3 = Vector2f::operator[]((Vector2f *)in_RDX,1);
    fVar7 = *pfVar3;
    pfVar3 = Vector2f::operator[]((Vector2f *)in_RDX,1);
    dVar4 = std::floor((double)(ulong)(uint)*pfVar3);
    clamp(in_RSI,fVar7 - SUB84(dVar4,0));
    get::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)v0,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    ::operator*((Vector3f *)in_RDX,f);
    ::operator*((Vector3f *)in_RDX,f);
    get::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)v0,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    ::operator*((Vector3f *)in_RDX,f);
    ::operator*((Vector3f *)in_RDX,f);
    ::operator+(v0,in_RDI);
    get::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)v0,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    ::operator*((Vector3f *)in_RDX,f);
    ::operator*((Vector3f *)in_RDX,f);
    ::operator+(v0,in_RDI);
    get::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)v0,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    ::operator*((Vector3f *)in_RDX,f);
    ::operator*((Vector3f *)in_RDX,f);
    VVar5 = ::operator+(v0,in_RDI);
  }
  VVar6.m_elements[0] = VVar5.m_elements[0];
  uVar8._4_4_ = VVar5.m_elements[1];
  register0x00001240 = VVar5.m_elements[2];
  return (Vector3f)VVar6.m_elements;
}

Assistant:

Vector3f get(Vector2f x) const
	{
		switch (type)
		{
		case TEXTURE_COLOR: return color;
		case TEXTURE_SCALE:
			/*
			std::cerr << source << "!!\n";
			std::cerr << x[0] << "," << x[1] << "\n";
			std::cerr << scale(x)[0] << "|" << scale(x)[1] << "\n";*/
			return source->get(scale(x));
		case TEXTURE_RECT:
			auto pix = [&](int a, int b) {
				if (a < 0 || b < 0 || a >= image_w || b >= image_h)
					return Vector3f::ZERO;
				Vector3f g;
				if (image_buff_stbi != nullptr) {
					for (int x = 0; x < 3; ++x)
						g[x] = image_buff_stbi[a * image_c + b * image_w * image_c + x] / 255.0;
				}
				else {
					for (int x = 0; x < 3; ++x)
						g[x] = hdr_buff[b * image_c + a * image_h * image_c + x];// 0.8);
				}
				return g;
			};
			float a = clamp(x[0]-floor(x[0])) * (image_w - 1), b = clamp(x[1]-floor(x[1])) * (image_h - 1);
			//return pix(int(a + 0.5), int(b + 0.5));
			int l = a, r = b; float p = a - l, q = b - r;
			return pix(l, r) * (1 - p) * (1 - q) + pix(l, r + 1) * (1 - p) * q + pix(l + 1, r) * p * (1 - q) + pix(l + 1, r + 1) * p * q;
		}
	}